

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow_query_result.cpp
# Opt level: O2

vector<duckdb::unique_ptr<duckdb::ArrowArrayWrapper,_std::default_delete<duckdb::ArrowArrayWrapper>,_true>,_true>
* __thiscall duckdb::ArrowQueryResult::Arrays(ArrowQueryResult *this)

{
  bool bVar1;
  InvalidInputException *this_00;
  string *psVar2;
  allocator local_59;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string local_38;
  
  bVar1 = BaseQueryResult::HasError((BaseQueryResult *)this);
  if (!bVar1) {
    return &this->arrays;
  }
  this_00 = (InvalidInputException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_38,
             "Attempting to fetch ArrowArrays from an unsuccessful query result\n: Error %s",
             &local_59);
  psVar2 = BaseQueryResult::GetError_abi_cxx11_((BaseQueryResult *)this);
  ::std::__cxx11::string::string((string *)&local_58,(string *)psVar2);
  InvalidInputException::InvalidInputException<std::__cxx11::string>(this_00,&local_38,&local_58);
  __cxa_throw(this_00,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

vector<unique_ptr<ArrowArrayWrapper>> &ArrowQueryResult::Arrays() {
	if (HasError()) {
		throw InvalidInputException("Attempting to fetch ArrowArrays from an unsuccessful query result\n: Error %s",
		                            GetError());
	}
	return arrays;
}